

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

precise_unit units::default_unit(string *unit_type)

{
  char cVar1;
  char *pcVar2;
  pointer pcVar3;
  precise_unit pVar4;
  precise_unit pVar5;
  precise_unit pVar6;
  precise_unit pVar7;
  precise_unit pVar8;
  precise_unit pVar9;
  precise_unit pVar10;
  precise_unit pVar11;
  int iVar12;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  _Var13;
  const_iterator cVar14;
  long lVar15;
  ulong uVar16;
  size_type sVar17;
  size_type sVar18;
  bool bVar19;
  precise_unit pVar20;
  precise_unit tunit;
  undefined1 local_208 [16];
  long local_1f8 [2];
  string local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  string local_48;
  
  if ((default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_ == '\0') &&
     (iVar12 = __cxa_guard_acquire(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_
                                  ), iVar12 != 0)) {
    loadDefinedMeasurementTypes_abi_cxx11_();
    __cxa_atexit(std::
                 unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>_>
                 ::~unordered_map,&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_);
  }
  _Var13._M_current = (unit_type->_M_dataplus)._M_p;
  sVar18 = unit_type->_M_string_length;
  if (sVar18 != 0) {
    if (sVar18 == 1) {
      cVar1 = *_Var13._M_current;
      switch(cVar1) {
      case 'I':
        pVar11.base_units_ = (unit_data)0x800;
        pVar11.commodity_ = 0;
        pVar11.multiplier_ = 1.0;
        return pVar11;
      case 'J':
        pVar10.base_units_ = (unit_data)0x4000;
        pVar10.commodity_ = 0;
        pVar10.multiplier_ = 1.0;
        return pVar10;
      case 'K':
      case 'O':
      case 'P':
      case 'Q':
      case 'R':
      case 'S':
        break;
      case 'L':
        pVar9.base_units_ = (unit_data)0x1;
        pVar9.commodity_ = 0;
        pVar9.multiplier_ = 1.0;
        return pVar9;
      case 'M':
        pVar8.base_units_ = (unit_data)0x100;
        pVar8.commodity_ = 0;
        pVar8.multiplier_ = 1.0;
        return pVar8;
      case 'N':
        pVar7.base_units_ = (unit_data)0x80000;
        pVar7.commodity_ = 0;
        pVar7.multiplier_ = 1.0;
        return pVar7;
      case 'T':
        pVar6.base_units_ = (unit_data)0x10;
        pVar6.commodity_ = 0;
        pVar6.multiplier_ = 1.0;
        return pVar6;
      default:
        if (cVar1 == 'l') {
          return (precise_unit)ZEXT816(0x3ff0000000000000);
        }
        if (cVar1 == -0x38) {
          pVar20.base_units_ = (unit_data)0x10000;
          pVar20.commodity_ = 0;
          pVar20.multiplier_ = 1.0;
          return pVar20;
        }
      }
    }
    sVar17 = 0;
    do {
      iVar12 = tolower((int)_Var13._M_current[sVar17]);
      _Var13._M_current[sVar17] = (char)iVar12;
      sVar17 = sVar17 + 1;
    } while (sVar18 != sVar17);
    _Var13._M_current = (unit_type->_M_dataplus)._M_p;
    sVar18 = unit_type->_M_string_length;
  }
  local_208[0] = 0x20;
  _Var13 = std::
           __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                     (_Var13,_Var13._M_current + sVar18,(_Iter_equals_val<const_char>)local_208);
  unit_type->_M_string_length = (long)_Var13._M_current - (long)(unit_type->_M_dataplus)._M_p;
  *_Var13._M_current = '\0';
  cVar14 = std::
           _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
           ::find(&default_unit(std::__cxx11::string)::measurement_types_abi_cxx11_._M_h,unit_type);
  if (cVar14.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
      ._M_cur != (__node_type *)0x0) {
    return *(precise_unit *)
            ((long)cVar14.
                   super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_units::precise_unit>,_true>
                   ._M_cur + 0x28);
  }
  pcVar2 = (unit_type->_M_dataplus)._M_p;
  if (*pcVar2 == '{') {
    if (pcVar2[unit_type->_M_string_length - 1] != '}') goto LAB_0017b50d;
  }
  else if ((*pcVar2 != '[') || (pcVar2[unit_type->_M_string_length - 1] != ']')) {
LAB_0017b50d:
    iVar12 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0xa);
    if (iVar12 != 0) {
      iVar12 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0x9);
      if (iVar12 == 0) {
        std::__cxx11::string::substr((ulong)&local_88,(ulong)unit_type);
        pVar20 = default_unit(&local_88);
        local_68.field_2._M_allocated_capacity = local_88.field_2._M_allocated_capacity;
        local_68._M_dataplus._M_p = local_88._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_88._M_dataplus._M_p == &local_88.field_2) {
          return pVar20;
        }
        goto LAB_0017b776;
      }
      iVar12 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0x6);
      if (iVar12 == 0) {
        std::__cxx11::string::substr((ulong)&local_a8,(ulong)unit_type);
        local_208 = (undefined1  [16])default_unit(&local_a8);
        pVar20 = precise_unit::operator/((precise_unit *)local_208,(precise_unit *)precise::s);
        local_68.field_2._M_allocated_capacity = local_a8.field_2._M_allocated_capacity;
        local_68._M_dataplus._M_p = local_a8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_a8._M_dataplus._M_p == &local_a8.field_2) {
          return pVar20;
        }
        goto LAB_0017b776;
      }
      lVar15 = std::__cxx11::string::rfind((char *)unit_type,0x1940de,0xffffffffffffffff);
      if (lVar15 != -1) {
        std::__cxx11::string::substr((ulong)&local_c8,(ulong)unit_type);
        pVar20 = default_unit(&local_c8);
        local_68.field_2._M_allocated_capacity = local_c8.field_2._M_allocated_capacity;
        local_68._M_dataplus._M_p = local_c8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_c8._M_dataplus._M_p == &local_c8.field_2) {
          return pVar20;
        }
        goto LAB_0017b776;
      }
      lVar15 = std::__cxx11::string::find_first_of((char *)unit_type,0x1940e8,0);
      if (lVar15 != -1) {
        std::__cxx11::string::substr((ulong)&local_e8,(ulong)unit_type);
        pVar20 = default_unit(&local_e8);
        local_68.field_2._M_allocated_capacity = local_e8.field_2._M_allocated_capacity;
        local_68._M_dataplus._M_p = local_e8._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
          return pVar20;
        }
        goto LAB_0017b776;
      }
      iVar12 = std::__cxx11::string::compare((ulong)unit_type,0,(char *)0x3);
      if (iVar12 == 0) {
        std::__cxx11::string::substr((ulong)&local_108,(ulong)unit_type);
        pVar20 = default_unit(&local_108);
        local_208 = (undefined1  [16])pVar20;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_108._M_dataplus._M_p != &local_108.field_2) {
          operator_delete(local_108._M_dataplus._M_p,local_108.field_2._M_allocated_capacity + 1);
        }
        if (pVar20.base_units_ != (unit_data)0xfa94a488 && !NAN(pVar20.multiplier_)) {
          pVar20 = precise_unit::inv((precise_unit *)local_208);
          return pVar20;
        }
      }
      local_208._0_8_ = local_1f8;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"rto","");
      uVar16 = (long)unit_type->_M_string_length - local_208._8_8_;
      if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ || uVar16 == 0) {
        bVar19 = false;
      }
      else {
        iVar12 = std::__cxx11::string::compare((ulong)unit_type,uVar16,(string *)local_208._8_8_);
        bVar19 = iVar12 == 0;
      }
      if ((long *)local_208._0_8_ != local_1f8) {
        operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
      }
      if (!bVar19) {
        local_208._0_8_ = local_1f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"fr","");
        uVar16 = (long)unit_type->_M_string_length - local_208._8_8_;
        if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ || uVar16 == 0) {
          bVar19 = false;
        }
        else {
          iVar12 = std::__cxx11::string::compare((ulong)unit_type,uVar16,(string *)local_208._8_8_);
          bVar19 = iVar12 == 0;
        }
        if ((long *)local_208._0_8_ != local_1f8) {
          operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
        }
        if (!bVar19) {
          local_208._0_8_ = local_1f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"quantity","");
          uVar16 = (long)unit_type->_M_string_length - local_208._8_8_;
          if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ || uVar16 == 0) {
            bVar19 = false;
          }
          else {
            iVar12 = std::__cxx11::string::compare
                               ((ulong)unit_type,uVar16,(string *)local_208._8_8_);
            bVar19 = iVar12 == 0;
          }
          if ((long *)local_208._0_8_ != local_1f8) {
            operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
          }
          if (bVar19) {
            std::__cxx11::string::substr((ulong)&local_128,(ulong)unit_type);
            pVar20 = default_unit(&local_128);
            local_68.field_2._M_allocated_capacity = local_128.field_2._M_allocated_capacity;
            local_68._M_dataplus._M_p = local_128._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_128._M_dataplus._M_p == &local_128.field_2) {
              return pVar20;
            }
            goto LAB_0017b776;
          }
          local_208._0_8_ = local_1f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"quantities","");
          uVar16 = (long)unit_type->_M_string_length - local_208._8_8_;
          if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ || uVar16 == 0) {
            bVar19 = false;
          }
          else {
            iVar12 = std::__cxx11::string::compare
                               ((ulong)unit_type,uVar16,(string *)local_208._8_8_);
            bVar19 = iVar12 == 0;
          }
          if ((long *)local_208._0_8_ != local_1f8) {
            operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
          }
          if (bVar19) {
            std::__cxx11::string::substr((ulong)&local_148,(ulong)unit_type);
            pVar20 = default_unit(&local_148);
            local_68.field_2._M_allocated_capacity = local_148.field_2._M_allocated_capacity;
            local_68._M_dataplus._M_p = local_148._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_148._M_dataplus._M_p == &local_148.field_2) {
              return pVar20;
            }
            goto LAB_0017b776;
          }
          local_208._0_8_ = local_1f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"measure","");
          uVar16 = (long)unit_type->_M_string_length - local_208._8_8_;
          if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ || uVar16 == 0) {
            bVar19 = false;
          }
          else {
            iVar12 = std::__cxx11::string::compare
                               ((ulong)unit_type,uVar16,(string *)local_208._8_8_);
            bVar19 = iVar12 == 0;
          }
          if ((long *)local_208._0_8_ != local_1f8) {
            operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
          }
          if (bVar19) {
            std::__cxx11::string::substr((ulong)&local_168,(ulong)unit_type);
            pVar20 = default_unit(&local_168);
            local_68.field_2._M_allocated_capacity = local_168.field_2._M_allocated_capacity;
            local_68._M_dataplus._M_p = local_168._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_168._M_dataplus._M_p == &local_168.field_2) {
              return pVar20;
            }
            goto LAB_0017b776;
          }
          local_208._0_8_ = local_1f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"size","");
          uVar16 = (long)unit_type->_M_string_length - local_208._8_8_;
          if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ || uVar16 == 0) {
            bVar19 = false;
          }
          else {
            iVar12 = std::__cxx11::string::compare
                               ((ulong)unit_type,uVar16,(string *)local_208._8_8_);
            bVar19 = iVar12 == 0;
          }
          if ((long *)local_208._0_8_ != local_1f8) {
            operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
          }
          if (bVar19) {
            std::__cxx11::string::substr((ulong)&local_188,(ulong)unit_type);
            pVar20 = default_unit(&local_188);
            local_68.field_2._M_allocated_capacity = local_188.field_2._M_allocated_capacity;
            local_68._M_dataplus._M_p = local_188._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_188._M_dataplus._M_p == &local_188.field_2) {
              return pVar20;
            }
            goto LAB_0017b776;
          }
          if ((1 < unit_type->_M_string_length) &&
             ((unit_type->_M_dataplus)._M_p[unit_type->_M_string_length - 1] == 's')) {
            std::__cxx11::string::pop_back();
            pcVar3 = (unit_type->_M_dataplus)._M_p;
            local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_1c8,pcVar3,pcVar3 + unit_type->_M_string_length);
            pVar20 = default_unit(&local_1c8);
            local_68.field_2._M_allocated_capacity = local_1c8.field_2._M_allocated_capacity;
            local_68._M_dataplus._M_p = local_1c8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1c8._M_dataplus._M_p == &local_1c8.field_2) {
              return pVar20;
            }
            goto LAB_0017b776;
          }
          local_208._0_8_ = local_1f8;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_208,"rate","");
          uVar16 = (long)unit_type->_M_string_length - local_208._8_8_;
          if ((string *)unit_type->_M_string_length < (ulong)local_208._8_8_ || uVar16 == 0) {
            bVar19 = false;
          }
          else {
            iVar12 = std::__cxx11::string::compare
                               ((ulong)unit_type,uVar16,(string *)local_208._8_8_);
            bVar19 = iVar12 == 0;
          }
          if ((long *)local_208._0_8_ != local_1f8) {
            operator_delete((void *)local_208._0_8_,local_1f8[0] + 1);
          }
          if (bVar19) {
            std::__cxx11::string::substr((ulong)&local_1a8,(ulong)unit_type);
            local_208 = (undefined1  [16])default_unit(&local_1a8);
            pVar20 = precise_unit::operator/((precise_unit *)local_208,(precise_unit *)precise::s);
            local_68.field_2._M_allocated_capacity = local_1a8.field_2._M_allocated_capacity;
            local_68._M_dataplus._M_p = local_1a8._M_dataplus._M_p;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p == &local_1a8.field_2) {
              return pVar20;
            }
            goto LAB_0017b776;
          }
          pcVar3 = (unit_type->_M_dataplus)._M_p;
          local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1e8,pcVar3,pcVar3 + unit_type->_M_string_length);
          pVar20 = unit_from_string(&local_1e8,0x8000000);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
            operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
          }
          uVar16 = pVar20._8_8_ & 0xffffffff;
          if (uVar16 == 0xfa94a488 && NAN(pVar20.multiplier_)) {
            pVar5.base_units_ = (unit_data)0xfa94a488;
            pVar5.commodity_ = 0;
            pVar5.multiplier_ = NAN;
            return pVar5;
          }
          goto LAB_0017b8ec;
        }
      }
      uVar16 = 0;
LAB_0017b8ec:
      pVar4.base_units_ = (unit_data)(int)uVar16;
      pVar4.commodity_ = (int)(uVar16 >> 0x20);
      pVar4.multiplier_ = 1.0;
      return pVar4;
    }
    std::__cxx11::string::substr((ulong)&local_68,(ulong)unit_type);
    pVar20 = default_unit(&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p == &local_68.field_2) {
      return pVar20;
    }
    goto LAB_0017b776;
  }
  std::__cxx11::string::pop_back();
  std::__cxx11::string::substr((ulong)&local_48,(ulong)unit_type);
  pVar20 = default_unit(&local_48);
  local_68.field_2._M_allocated_capacity = local_48.field_2._M_allocated_capacity;
  local_68._M_dataplus._M_p = local_48._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p == &local_48.field_2) {
    return pVar20;
  }
LAB_0017b776:
  operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  return pVar20;
}

Assistant:

precise_unit default_unit(std::string unit_type)
{
    static const smap measurement_types = loadDefinedMeasurementTypes();

    if (unit_type.size() == 1) {
        switch (unit_type[0]) {
            case 'L':
                return precise::m;
            case 'M':
                return precise::kg;
            case 'T':
                return precise::second;
            case '\xC8':
                return precise::Kelvin;
            case 'I':
                return precise::A;
            case 'N':
                return precise::mol;
            case 'J':
                return precise::cd;
            case 'l':
                return precise::one;
        }
    }
    std::transform(
        unit_type.begin(), unit_type.end(), unit_type.begin(), ::tolower);
    unit_type.erase(
        std::remove(unit_type.begin(), unit_type.end(), ' '), unit_type.end());
    auto fnd = measurement_types.find(unit_type);
    if (fnd != measurement_types.end()) {
        return fnd->second;
    }
    if ((unit_type.front() == '[' && unit_type.back() == ']') ||
        (unit_type.front() == '{' && unit_type.back() == '}')) {
        unit_type.pop_back();
        return default_unit(unit_type.substr(1));
    }
    if (unit_type.compare(0, 10, "quantityof") == 0) {
        return default_unit(unit_type.substr(10));
    }
    if (unit_type.compare(0, 9, "measureof") == 0) {
        return default_unit(unit_type.substr(9));
    }
    if (unit_type.compare(0, 6, "rateof") == 0) {
        return default_unit(unit_type.substr(6)) / precise::s;
    }
    auto fof = unit_type.rfind("of");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    fof = unit_type.find_first_of("([{");
    if (fof != std::string::npos) {
        return default_unit(unit_type.substr(0, fof));
    }
    if (unit_type.compare(0, 3, "inv") == 0) {
        auto tunit = default_unit(unit_type.substr(3));
        if (!is_error(tunit)) {
            return tunit.inv();
        }
    }
    if (ends_with(unit_type, "rto")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "fr")) {
        // ratio of some kind
        return precise::one;
    }
    if (ends_with(unit_type, "quantity")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantity")));
    }
    if (ends_with(unit_type, "quantities")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("quantities")));
    }
    if (ends_with(unit_type, "measure")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("measure")));
    }
    if (ends_with(unit_type, "size")) {
        return default_unit(
            unit_type.substr(0, unit_type.size() - strlen("size")));
    }
    if (unit_type.back() == 's' && unit_type.size() > 1) {
        unit_type.pop_back();
        return default_unit(unit_type);
    }
    if (ends_with(unit_type, "rate")) {
        return default_unit(
                   unit_type.substr(0, unit_type.size() - strlen("rate"))) /
            precise::s;
    }
    auto retunit = unit_from_string(unit_type, no_default_units);
    if (is_valid(retunit)) {
        return precise_unit(retunit.base_units());
    }
    return precise::invalid;
}